

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

texts * __thiscall
lest::make_texts<char_const*[3]>(texts *__return_storage_ptr__,lest *this,char *(*c) [3])

{
  char **in_RCX;
  
  make<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char_const*>
            (__return_storage_ptr__,this,(char **)(this + 0x18),in_RCX);
  return __return_storage_ptr__;
}

Assistant:

tests make_tests( C const & c ) { return make_tests( test_begin( c ), test_end( c ) ); }